

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::pushFunctionScope
          (CheckerVisitor *this,VarScope *functionScope,FunctionDecl *decl)

{
  mapped_type *ppFVar1;
  FunctionInfo *this_00;
  undefined8 in_RSI;
  FunctionDecl *in_RDI;
  FunctionInfo *info;
  key_type *in_stack_ffffffffffffffc8;
  FunctionDecl *in_stack_ffffffffffffffd0;
  
  ppFVar1 = std::
            unordered_map<const_SQCompilation::FunctionDecl_*,_SQCompilation::FunctionInfo_*,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>_>
            ::operator[]((unordered_map<const_SQCompilation::FunctionDecl_*,_SQCompilation::FunctionInfo_*,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>_>
                          *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (*ppFVar1 == (mapped_type)0x0) {
    this_00 = makeFunctionInfo((CheckerVisitor *)0x0,in_RDI,in_stack_ffffffffffffffd0);
    ppFVar1 = std::
              unordered_map<const_SQCompilation::FunctionDecl_*,_SQCompilation::FunctionInfo_*,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>_>
              ::operator[]((unordered_map<const_SQCompilation::FunctionDecl_*,_SQCompilation::FunctionInfo_*,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>_>
                            *)this_00,in_stack_ffffffffffffffc8);
    *ppFVar1 = this_00;
  }
  (in_RDI->_parameters)._size = (int)in_RSI;
  (in_RDI->_parameters)._allocated = (int)((ulong)in_RSI >> 0x20);
  return;
}

Assistant:

void CheckerVisitor::pushFunctionScope(VarScope *functionScope, const FunctionDecl *decl) {

  FunctionInfo *info = functionInfoMap[decl];

  if (!info) {
    info = makeFunctionInfo(decl, currentScope->owner);
    functionInfoMap[decl] = info;
  }

  currentScope = functionScope;
}